

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O2

iuIParamGenerator<int> * __thiscall
iutest::detail::iuValuesParamsGeneratorHolder::operator_cast_to_iuIParamGenerator_
          (iuValuesParamsGeneratorHolder *this)

{
  iuValuesInParamsGenerator<int> *this_00;
  allocator_type local_29;
  vector<int,_std::allocator<int>_> params;
  
  std::vector<int,_std::allocator<int>_>::vector(&params,*(size_type *)this,&local_29);
  std::
  generate<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,iutest::detail::iuTypedRandom<int>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             params.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      params.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,(iuTypedRandom<int>)*(Engine *)(this + 8));
  this_00 = (iuValuesInParamsGenerator<int> *)operator_new(0x28);
  iuValuesInParamsGenerator<int>::iuValuesInParamsGenerator(this_00,&params);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&params.super__Vector_base<int,_std::allocator<int>_>);
  return &this_00->super_iuIParamGenerator<int>;
}

Assistant:

operator iuIParamGenerator<T>* () const
    {
        ::std::vector<T> params(m_num);
        ::std::generate(params.begin(), params.end(), m_g);
        return new iuValuesInParamsGenerator<T>( params );
    }